

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cl_generator.cc
# Opt level: O0

void __thiscall t_cl_generator::package_def(t_cl_generator *this,ostream *out)

{
  t_program *this_00;
  vector<t_program_*,_std::allocator<t_program_*>_> *this_01;
  bool bVar1;
  ostream *poVar2;
  size_type sVar3;
  reference pptVar4;
  string *psVar5;
  void *this_02;
  t_program *include;
  const_iterator __end2;
  const_iterator __begin2;
  vector<t_program_*,_std::allocator<t_program_*>_> *__range2;
  string local_40;
  vector<t_program_*,_std::allocator<t_program_*>_> *local_20;
  vector<t_program_*,_std::allocator<t_program_*>_> *includes;
  ostream *out_local;
  t_cl_generator *this_local;
  
  includes = (vector<t_program_*,_std::allocator<t_program_*>_> *)out;
  out_local = (ostream *)this;
  local_20 = t_program::get_includes((this->super_t_oop_generator).super_t_generator.program_);
  poVar2 = std::operator<<((ostream *)includes,"(thrift:def-package :");
  package_abi_cxx11_(&local_40,this);
  std::operator<<(poVar2,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  sVar3 = std::vector<t_program_*,_std::allocator<t_program_*>_>::size(local_20);
  if (sVar3 != 0) {
    std::operator<<((ostream *)includes," :use (");
    this_01 = local_20;
    __end2 = std::vector<t_program_*,_std::allocator<t_program_*>_>::begin(local_20);
    include = (t_program *)std::vector<t_program_*,_std::allocator<t_program_*>_>::end(this_01);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<t_program_*const_*,_std::vector<t_program_*,_std::allocator<t_program_*>_>_>
                                  *)&include);
      if (!bVar1) break;
      pptVar4 = __gnu_cxx::
                __normal_iterator<t_program_*const_*,_std::vector<t_program_*,_std::allocator<t_program_*>_>_>
                ::operator*(&__end2);
      this_00 = *pptVar4;
      poVar2 = std::operator<<((ostream *)includes," :");
      psVar5 = t_program::get_name_abi_cxx11_(this_00);
      std::operator<<(poVar2,(string *)psVar5);
      __gnu_cxx::
      __normal_iterator<t_program_*const_*,_std::vector<t_program_*,_std::allocator<t_program_*>_>_>
      ::operator++(&__end2);
    }
    std::operator<<((ostream *)includes,")");
  }
  poVar2 = std::operator<<((ostream *)includes,")");
  this_02 = (void *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(this_02,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void t_cl_generator::package_def(std::ostream &out) {
  const vector<t_program*>& includes = program_->get_includes();

  out << "(thrift:def-package :" << package();
  if ( includes.size() > 0 ) {
    out << " :use (";
    for (auto include : includes) {
      out << " :" << include->get_name();
    }
    out << ")";
  }
  out << ")" << endl << endl;
}